

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringMap.cpp
# Opt level: O1

uint __thiscall llvm::StringMapImpl::RehashTable(StringMapImpl *this,uint BucketNo)

{
  uint uVar1;
  uint uVar2;
  StringMapEntryBase **ppSVar3;
  StringMapEntryBase *pSVar4;
  ulong uVar5;
  StringMapEntryBase **ppSVar6;
  ulong uVar7;
  int iVar8;
  ulong uVar9;
  ulong uVar10;
  uint uVar11;
  ulong uVar12;
  uint uVar13;
  
  uVar5 = (ulong)BucketNo;
  ppSVar3 = this->TheTable;
  uVar13 = this->NumBuckets;
  uVar9 = (ulong)uVar13;
  if (uVar13 * 3 < this->NumItems * 4) {
    uVar13 = uVar13 * 2;
  }
  else if (uVar13 >> 3 < uVar13 - (this->NumItems + this->NumTombstones)) {
    return BucketNo;
  }
  ppSVar6 = (StringMapEntryBase **)safe_calloc((ulong)(uVar13 + 1),0xc);
  ppSVar6[uVar13] = (StringMapEntryBase *)0x2;
  uVar1 = this->NumBuckets;
  if ((ulong)uVar1 != 0) {
    uVar10 = 0;
    uVar7 = uVar5;
    do {
      pSVar4 = this->TheTable[uVar10];
      if ((pSVar4 != (StringMapEntryBase *)0xfffffffffffffff8) &&
         (pSVar4 != (StringMapEntryBase *)0x0)) {
        uVar2 = *(uint *)((long)ppSVar3 + uVar10 * 4 + uVar9 * 8 + 8);
        uVar12 = (ulong)(uVar2 & uVar13 - 1);
        if (ppSVar6[uVar12] != (StringMapEntryBase *)0x0) {
          iVar8 = 1;
          do {
            uVar11 = (int)uVar12 + iVar8;
            iVar8 = iVar8 + 1;
            uVar12 = (ulong)(uVar11 & uVar13 - 1);
          } while (ppSVar6[uVar12] != (StringMapEntryBase *)0x0);
        }
        ppSVar6[uVar12] = pSVar4;
        *(uint *)((long)ppSVar6 + uVar12 * 4 + (ulong)uVar13 * 8 + 8) = uVar2;
        if (uVar10 == uVar5) {
          uVar7 = uVar12;
        }
      }
      BucketNo = (uint)uVar7;
      uVar10 = uVar10 + 1;
    } while (uVar10 != uVar1);
  }
  free(this->TheTable);
  this->TheTable = ppSVar6;
  this->NumBuckets = uVar13;
  this->NumTombstones = 0;
  return BucketNo;
}

Assistant:

unsigned StringMapImpl::RehashTable(unsigned BucketNo) {
  unsigned NewSize;
  unsigned *HashTable = (unsigned *)(TheTable + NumBuckets + 1);

  // If the hash table is now more than 3/4 full, or if fewer than 1/8 of
  // the buckets are empty (meaning that many are filled with tombstones),
  // grow/rehash the table.
  if (LLVM_UNLIKELY(NumItems * 4 > NumBuckets * 3)) {
    NewSize = NumBuckets*2;
  } else if (LLVM_UNLIKELY(NumBuckets - (NumItems + NumTombstones) <=
                           NumBuckets / 8)) {
    NewSize = NumBuckets;
  } else {
    return BucketNo;
  }

  unsigned NewBucketNo = BucketNo;
  // Allocate one extra bucket which will always be non-empty.  This allows the
  // iterators to stop at end.
  auto NewTableArray = static_cast<StringMapEntryBase **>(
      safe_calloc(NewSize+1, sizeof(StringMapEntryBase *) + sizeof(unsigned)));

  unsigned *NewHashArray = (unsigned *)(NewTableArray + NewSize + 1);
  NewTableArray[NewSize] = (StringMapEntryBase*)2;

  // Rehash all the items into their new buckets.  Luckily :) we already have
  // the hash values available, so we don't have to rehash any strings.
  for (unsigned I = 0, E = NumBuckets; I != E; ++I) {
    StringMapEntryBase *Bucket = TheTable[I];
    if (Bucket && Bucket != getTombstoneVal()) {
      // Fast case, bucket available.
      unsigned FullHash = HashTable[I];
      unsigned NewBucket = FullHash & (NewSize-1);
      if (!NewTableArray[NewBucket]) {
        NewTableArray[FullHash & (NewSize-1)] = Bucket;
        NewHashArray[FullHash & (NewSize-1)] = FullHash;
        if (I == BucketNo)
          NewBucketNo = NewBucket;
        continue;
      }

      // Otherwise probe for a spot.
      unsigned ProbeSize = 1;
      do {
        NewBucket = (NewBucket + ProbeSize++) & (NewSize-1);
      } while (NewTableArray[NewBucket]);

      // Finally found a slot.  Fill it in.
      NewTableArray[NewBucket] = Bucket;
      NewHashArray[NewBucket] = FullHash;
      if (I == BucketNo)
        NewBucketNo = NewBucket;
    }
  }

  free(TheTable);

  TheTable = NewTableArray;
  NumBuckets = NewSize;
  NumTombstones = 0;
  return NewBucketNo;
}